

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ap.c
# Opt level: O3

void main_cold_9(void)

{
  fwrite("argv[0] is missing\n",0x13,1,_stdout);
  return;
}

Assistant:

static int parse_command_line (AP_CTX *ctx, int argc, char *argv[])
{
	int				rc				= AP_NO_ERROR;
	AP_LOG_LEVEL	log_level;
	size_t			log_level_len;
	char			*next_arg		= NULL;

	switch (argc)
	{
		case 0:
		{
			fprintf (stdout, "argv[0] is missing\n");
			rc = AP_ERROR_CMDLINE;

			break;
		}
			
		case 1:
		{
			break;
		}

		default:
		{
			if (argc > 8)
			{
				fprintf (stdout, "Too many arguments\n");
				show_help ();
				rc = AP_ERROR_CMDLINE;

				break;
			}
			
			argv ++;
			while (*argv != NULL)
			{
				next_arg = *(argv + 1);

				if (strcmp (*argv, "-c") == 0)
				{
					if (next_arg != NULL)
					{
						ctx->config_path = strdup (next_arg);
						if (ctx->config_path == NULL)
						{
							fprintf (stdout, "Cannot allocate memory for 'ctx->config_path'\n");
							rc = AP_ERROR_NO_MEMORY;
							
							break;
						}

						argv += 2;
					}
					else
					{
						fprintf (stdout, "'%s' requires an argument\n", *argv);
						show_help ();
						rc = AP_ERROR_CMDLINE;

						break;
					}
				}
				else if (strcmp (*argv, "-l") == 0)
				{
					if (next_arg != NULL)
					{
						ctx->log_path = strdup (next_arg);
						if (ctx->log_path == NULL)
						{
							fprintf (stdout, "Cannot allocate memory for 'ctx->log_path'\n");
							rc = AP_ERROR_NO_MEMORY;
							
							break;
						}

						argv += 2;
					}
					else
					{
						fprintf (stdout, "'%s' requires an argument\n", *argv);
						show_help ();
						rc = AP_ERROR_CMDLINE;

						break;
					}
				}
				else if (strcmp (*argv, "-e") == 0)
				{
					if (next_arg != NULL)
					{
						log_level_len = strlen (next_arg);
						if (log_level_len != 1)
						{
							fprintf (stdout, "Invalid log level '%s'\n", next_arg);
							show_help ();
							rc = AP_ERROR_CMDLINE;

							break;
						}

						if (next_arg[0] < '0' || next_arg[0] > '5')
						{
							fprintf (stdout, "Invalid log level '%s'\n", next_arg);
							show_help ();
							rc = AP_ERROR_CMDLINE;

							break;
						}

						log_level = next_arg[0] - '0';

						ap_log_set_level (log_level);

						argv += 2;
					}
					else
					{
						fprintf (stdout, "'%s' requires an argument\n", *argv);
						show_help ();
						rc = AP_ERROR_CMDLINE;

						break;
					}
				}
				else if (strcmp (*argv, "-s") == 0)
				{
					ctx->simulate = TRUE;

					argv += 1;
				}
				else if (strcmp (*argv, "-v") == 0)
				{
					show_version ();
					rc = AP_ERROR_VERSION;

					goto finish;
				}
				else if (strcmp (*argv, "-h") == 0)
				{
					show_help ();
					rc = AP_ERROR_HELP;

					goto finish;
				}
				else
				{
					fprintf (stdout, "Invalid argument '%s'\n", *argv);
					show_help ();
					rc = AP_ERROR_CMDLINE;

					goto finish;
				}
			}
		}
	}

finish:
	if (rc != AP_NO_ERROR && rc != AP_ERROR_VERSION && rc != AP_ERROR_HELP)
	{
		uninit (ctx);
	}

	return rc;
}